

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_listen_on_data(intptr_t uuid,fio_protocol_s *pr_)

{
  intptr_t iVar1;
  intptr_t client;
  int i;
  fio_listen_protocol_s *pr;
  fio_protocol_s *pr__local;
  intptr_t uuid_local;
  
  client._4_4_ = 0;
  while ((client._4_4_ < 4 && (iVar1 = fio_accept(uuid), iVar1 != -1))) {
    (*pr_[1].on_shutdown)(iVar1,(fio_protocol_s *)pr_[1].on_ready);
    client._4_4_ = client._4_4_ + 1;
  }
  return;
}

Assistant:

static void fio_listen_on_data(intptr_t uuid, fio_protocol_s *pr_) {
  fio_listen_protocol_s *pr = (fio_listen_protocol_s *)pr_;
  for (int i = 0; i < 4; ++i) {
    intptr_t client = fio_accept(uuid);
    if (client == -1)
      return;
    pr->on_open(client, pr->udata);
  }
}